

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

Gia_Man_t * Mf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  uint uVar1;
  Jf_Par_t *pJVar2;
  Vec_Mem_t *p;
  char *pcVar3;
  Gia_Man_t *pGVar4;
  Mf_Man_t *p_00;
  FILE *__stream;
  word *pwVar5;
  Gia_Man_t *p_01;
  Cnf_Dat_t *pCVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  byte bVar11;
  int iVar12;
  char local_418 [1000];
  
  if (pPars->fGenCnf != 0) {
    pPars->fCutMin = 1;
  }
  pGVar4 = pGia;
  if (pGia->pSibls == (int *)0x0) {
    if (pPars->fCoarsen != 0) {
      pGVar4 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
    }
  }
  else {
    pPars->fCoarsen = 0;
    pPars->fCutMin = 1;
  }
  p_00 = Mf_ManAlloc(pGVar4,pPars);
  p_00->pGia0 = pGia;
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    putchar(10);
    printf("Derived ");
    Gia_ManPrintMuxStats(pGVar4);
    putchar(10);
  }
  Mf_ManPrintInit(p_00);
  Mf_ManComputeCuts(p_00);
  pJVar2 = p_00->pPars;
  iVar10 = 1;
  while( true ) {
    p_00->Iter = iVar10;
    iVar12 = pJVar2->nRounds;
    if (iVar12 <= iVar10) break;
    Mf_ManComputeMapping(p_00);
    iVar10 = iVar10 + 1;
  }
  p_00->fUseEla = 1;
  while (iVar10 < iVar12 + pPars->nRoundsEla) {
    Mf_ManComputeMapping(p_00);
    iVar10 = iVar10 + 1;
    p_00->Iter = iVar10;
    iVar12 = pJVar2->nRounds;
  }
  if ((pPars->fVeryVerbose != 0) && (pPars->fCutMin != 0)) {
    p = p_00->vTtMem;
    pcVar3 = p_00->pGia->pName;
    uVar1 = pPars->nLutSize;
    sprintf(local_418,"tt_%s_%02d.txt",pcVar3,(ulong)uVar1);
    __stream = _stdout;
    if ((pcVar3 == (char *)0x0) || (__stream = fopen(local_418,"wb"), _stdout == __stream)) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)p->nEntries);
    }
    iVar10 = 0;
    while ((iVar10 < p->nEntries && (pwVar5 = Vec_MemReadEntry(p,iVar10), pwVar5 != (word *)0x0))) {
      uVar9 = (ulong)(uint)p->nEntrySize;
      while (0 < (int)uVar9) {
        uVar9 = uVar9 - 1;
        bVar11 = 0x3c;
        for (iVar12 = 0xf; -1 < iVar12; iVar12 = iVar12 + -1) {
          uVar8 = (uint)(pwVar5[uVar9] >> (bVar11 & 0x3f)) & 0xf;
          if (uVar8 < 10) {
            fprintf(__stream,"%d");
          }
          else {
            fputc(uVar8 + 0x37,__stream);
          }
          bVar11 = bVar11 - 4;
        }
      }
      fputc(10,__stream);
      iVar10 = iVar10 + 1;
    }
    if (__stream != _stdout) {
      fclose(__stream);
    }
    pcVar7 = local_418;
    if (pcVar3 == (char *)0x0) {
      pcVar7 = "stdout";
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)p->nEntrySize * (double)p->nEntries * 8.0 * 9.5367431640625e-07,
           (ulong)(uint)p->nEntries,(ulong)uVar1,pcVar7);
  }
  if (pPars->fCutMin == 0) {
    if (pPars->fCoarsen == 0) {
      p_01 = Mf_ManDeriveMapping(p_00);
    }
    else {
      p_01 = Mf_ManDeriveMappingCoarse(p_00);
    }
  }
  else {
    p_01 = Mf_ManDeriveMappingGia(p_00);
  }
  pJVar2 = p_00->pPars;
  if (pJVar2->fGenCnf != 0) {
    pCVar6 = Mf_ManDeriveCnf(p_00,pJVar2->fCnfObjIds,pJVar2->fAddOrCla);
    pGia->pData = pCVar6;
  }
  Gia_ManMappingVerify(p_01);
  Mf_ManPrintQuit(p_00,p_01);
  Mf_ManFree(p_00);
  if (pGVar4 != pGia) {
    Gia_ManStop(pGVar4);
  }
  return p_01;
}

Assistant:

Gia_Man_t * Mf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Mf_Man_t * p;
    Gia_Man_t * pNew, * pCls;
    if ( pPars->fGenCnf )
        pPars->fCutMin = 1;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCutMin = 1, pPars->fCoarsen = 0; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Mf_ManAlloc( pCls, pPars );
    p->pGia0 = pGia;
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Mf_ManPrintInit( p );
    Mf_ManComputeCuts( p );
    for ( p->Iter = 1; p->Iter < p->pPars->nRounds; p->Iter++ )
        Mf_ManComputeMapping( p );
    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
        Mf_ManComputeMapping( p );
    if ( pPars->fVeryVerbose && pPars->fCutMin )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), pPars->nLutSize );
    if ( pPars->fCutMin )
        pNew = Mf_ManDeriveMappingGia( p );
    else if ( pPars->fCoarsen )
        pNew = Mf_ManDeriveMappingCoarse( p );
    else
        pNew = Mf_ManDeriveMapping( p );
    if ( p->pPars->fGenCnf )
        pGia->pData = Mf_ManDeriveCnf( p, p->pPars->fCnfObjIds, p->pPars->fAddOrCla );
//    if ( p->pPars->fGenCnf )
//        Mf_ManProfileTruths( p );
    Gia_ManMappingVerify( pNew );
    Mf_ManPrintQuit( p, pNew );
    Mf_ManFree( p );
    if ( pCls != pGia )
        Gia_ManStop( pCls );
    return pNew;
}